

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O3

char_class_type
boost::xpressive::cpp_regex_traits<char>::lookup_classname_impl_<char*>(char *begin,char *end)

{
  long lVar1;
  undefined1 *puVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  bool bVar6;
  
  pcVar3 = "alnum";
  lVar1 = 0;
  puVar2 = char_class(unsigned_long)::s_char_class_map;
  do {
    cVar5 = *pcVar3;
    bVar6 = cVar5 != '\0';
    pcVar4 = begin;
    if ((begin != end) && (cVar5 != '\0')) {
      do {
        pcVar3 = pcVar3 + 1;
        if (cVar5 != *pcVar4) goto LAB_00125552;
        pcVar4 = pcVar4 + 1;
        cVar5 = *pcVar3;
        bVar6 = cVar5 != '\0';
      } while ((bVar6) && (pcVar4 != end));
    }
    if (!(bool)(pcVar4 != end | bVar6)) {
      return *(char_class_type *)(puVar2 + 8);
    }
LAB_00125552:
    lVar1 = lVar1 + 1;
    puVar2 = char_class(unsigned_long)::s_char_class_map + lVar1 * 0x10;
    pcVar3 = *(char **)(char_class(unsigned_long)::s_char_class_map + lVar1 * 0x10);
    if (lVar1 == 0x10) {
      return 0;
    }
  } while( true );
}

Assistant:

static char_class_type lookup_classname_impl_(FwdIter begin, FwdIter end)
    {
        // find the classname
        typedef cpp_regex_traits<Char> this_t;
        for(std::size_t j = 0; 0 != this_t::char_class(j).class_name_; ++j)
        {
            if(this_t::compare_(this_t::char_class(j).class_name_, begin, end))
            {
                return this_t::char_class(j).class_type_;
            }
        }
        return 0;
    }